

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.cpp
# Opt level: O0

void __thiscall
StringifyTest_FilterReturn_Test::StringifyTest_FilterReturn_Test
          (StringifyTest_FilterReturn_Test *this)

{
  StringifyTest_FilterReturn_Test *this_local;
  
  PrintTest::PrintTest(&this->super_StringifyTest);
  (this->super_StringifyTest).super_Test._vptr_Test =
       (_func_int **)&PTR__StringifyTest_FilterReturn_Test_00572ec0;
  return;
}

Assistant:

TEST_F(StringifyTest, FilterReturn) {
  static auto branchesModuleText = R"wasm(
  (module
    (func $a (result i32)
      (return (i32.const 0))
    )
    (func $b (result i32)
      (return (i32.const 0))
    )
   )
  )wasm";
  Module wasm;
  parseWast(wasm, branchesModuleText);
  HashStringifyWalker stringify = HashStringifyWalker();
  stringify.walkModule(&wasm);
  auto substrings = StringifyProcessor::repeatSubstrings(stringify.hashString);
  auto result = StringifyProcessor::filterBranches(substrings, stringify.exprs);

  EXPECT_EQ(result, (std::vector<SuffixTree::RepeatedSubstring>{}));
}